

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void assert_is_file_type(uv_dirent_t dent)

{
  uv_fs_t *puVar1;
  
  puVar1 = (uv_fs_t *)dent.name;
  if ((uint)dent.name < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar1 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00153ce9;
    if (stat_req.result != 0) goto LAB_00153cee;
    if (stat_req.ptr == (void *)0x0) goto LAB_00153cf3;
    stat_cb_count = stat_cb_count + 1;
    puVar1 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00153ce9:
    stat_cb_cold_2();
LAB_00153cee:
    stat_cb_cold_3();
LAB_00153cf3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar1 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00153d35;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00153d35:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar1 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00153d99;
    if (rmdir_req.result != 0) goto LAB_00153d9e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00153da8;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00153d99:
    rmdir_cb_cold_2();
LAB_00153d9e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00153da8:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void assert_is_file_type(uv_dirent_t dent) {
#ifdef HAVE_DIRENT_TYPES
  /*
   * For Apple and Windows, we know getdents is expected to work but for other
   * environments, the filesystem dictates whether or not getdents supports
   * returning the file type.
   *
   *   See:
   *     http://man7.org/linux/man-pages/man2/getdents.2.html
   *     https://github.com/libuv/libuv/issues/501
   */
  #if defined(__APPLE__) || defined(_WIN32)
    ASSERT(dent.type == UV_DIRENT_FILE);
  #else
    ASSERT(dent.type == UV_DIRENT_FILE || dent.type == UV_DIRENT_UNKNOWN);
  #endif
#else
  ASSERT(dent.type == UV_DIRENT_UNKNOWN);
#endif
}